

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcoluj.c
# Opt level: O3

int ffpclujj(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem,
            ULONGLONG *array,int *status)

{
  int iVar1;
  long lVar2;
  size_t sVar3;
  long ntodo;
  long lVar4;
  long incre;
  ULONGLONG *local_71d0;
  double zero;
  double scale;
  int hdutype;
  int tcode;
  LONGLONG elemnum;
  uint local_71a8;
  int maxelem;
  long local_71a0;
  LONGLONG repeat;
  long twidth;
  LONGLONG rowlen;
  LONGLONG startpos;
  char cform [20];
  char tform [20];
  LONGLONG tnull;
  char snull [20];
  char message [81];
  double cbuff [3600];
  
  iVar1 = *status;
  if (iVar1 < 1) {
    local_71d0 = array;
    iVar1 = ffgcprll(fptr,colnum,firstrow,firstelem,nelem,1,&scale,&zero,tform,&twidth,&tcode,
                     &maxelem,&startpos,&elemnum,&incre,&repeat,&rowlen,&hdutype,&tnull,snull,status
                    );
    if (iVar1 < 1) {
      local_71a8 = colnum;
      if (tcode == 0x10) {
        ffcfmt(tform,cform);
      }
      if (nelem == 0) {
        iVar1 = *status;
      }
      else {
        local_71a0 = 0;
        lVar4 = 0;
LAB_001ee07b:
        lVar2 = (long)maxelem;
        if (nelem < maxelem) {
          lVar2 = nelem;
        }
        ntodo = repeat - elemnum;
        if (lVar2 < repeat - elemnum) {
          ntodo = lVar2;
        }
        ffmbyt(fptr,elemnum * incre + rowlen * local_71a0 + startpos,1,status);
        if (tcode < 0x29) {
          if (tcode == 0xb) {
            ffu8fi1(local_71d0 + lVar4,ntodo,scale,zero,(uchar *)cbuff,status);
            ffpi1b(fptr,ntodo,incre,(uchar *)cbuff,status);
          }
          else if (tcode == 0x10) {
            sVar3 = strlen(cform);
            if (((hdutype != 1) || (sVar3 < 2)) ||
               ((cform[sVar3 - 1] != 'f' && (cform[sVar3 - 1] != 'E')))) goto LAB_001ee3e3;
            ffu8fstr(local_71d0 + lVar4,ntodo,scale,zero,cform,twidth,(char *)cbuff,status);
            if (incre - twidth == 0) {
              ffpbyt(fptr,incre * ntodo,cbuff,status);
            }
            else {
              ffpbytoff(fptr,twidth,ntodo,incre - twidth,cbuff,status);
            }
          }
          else {
            if (tcode != 0x15) {
LAB_001ee3e3:
              snprintf(message,0x51,"Cannot write numbers to column %d which has format %s",
                       (ulong)local_71a8,tform);
              ffpmsg(message);
              if (hdutype == 1) {
                *status = 0x137;
                return 0x137;
              }
              *status = 0x138;
              return 0x138;
            }
            ffu8fi2(local_71d0 + lVar4,ntodo,scale,zero,(short *)cbuff,status);
            ffpi2b(fptr,ntodo,incre,(short *)cbuff,status);
          }
        }
        else if (tcode < 0x51) {
          if (tcode == 0x29) {
            ffu8fi4(local_71d0 + lVar4,ntodo,scale,zero,(int *)cbuff,status);
            ffpi4b(fptr,ntodo,incre,(int *)cbuff,status);
          }
          else {
            if (tcode != 0x2a) goto LAB_001ee3e3;
            ffu8fr4(local_71d0 + lVar4,ntodo,scale,zero,(float *)cbuff,status);
            ffpr4b(fptr,ntodo,incre,(float *)cbuff,status);
          }
        }
        else if (tcode == 0x52) {
          ffu8fr8(local_71d0 + lVar4,ntodo,scale,zero,cbuff,status);
          ffpr8b(fptr,ntodo,incre,cbuff,status);
        }
        else {
          if (tcode != 0x51) goto LAB_001ee3e3;
          ffu8fi8(local_71d0 + lVar4,ntodo,scale,zero,(LONGLONG *)cbuff,status);
          ffpi8b(fptr,ntodo,incre,(long *)cbuff,status);
        }
        iVar1 = *status;
        if (0 < iVar1) {
          snprintf(message,0x51,
                   "Error writing elements %.0f thru %.0f of input data array (ffpcluj).",
                   (double)(lVar4 + 1),(double)(ntodo + lVar4));
          ffpmsg(message);
          goto LAB_001ee035;
        }
        nelem = nelem - ntodo;
        if (nelem != 0) {
          lVar4 = lVar4 + ntodo;
          elemnum = ntodo + elemnum;
          if (elemnum == repeat) {
            elemnum = 0;
            local_71a0 = local_71a0 + 1;
          }
          goto LAB_001ee07b;
        }
      }
      if (iVar1 == -0xb) {
        ffpmsg("Numerical overflow during type conversion while writing FITS data.");
        *status = 0x19c;
        iVar1 = 0x19c;
      }
    }
    else {
LAB_001ee035:
      iVar1 = *status;
    }
  }
  return iVar1;
}

Assistant:

int ffpclujj( fitsfile *fptr,  /* I - FITS file pointer                       */
            int  colnum,     /* I - number of column to write (1 = 1st col) */
            LONGLONG  firstrow,  /* I - first row to write (1 = 1st row)        */
            LONGLONG  firstelem, /* I - first vector element to write (1 = 1st) */
            LONGLONG  nelem,     /* I - number of values to write               */
            ULONGLONG  *array,    /* I - array of values to write                */
            int  *status)    /* IO - error status                           */
/*
  Write an array of values to a column in the current FITS HDU.
  The column number may refer to a real column in an ASCII or binary table, 
  or it may refer to a virtual column in a 1 or more grouped FITS primary
  array.  FITSIO treats a primary array as a binary table
  with 2 vector columns: the first column contains the group parameters (often
  with length = 0) and the second column contains the array of image pixels.
  Each row of the table represents a group in the case of multigroup FITS
  images.

  The input array of values will be converted to the datatype of the column 
  and will be inverse-scaled by the FITS TSCALn and TZEROn values if necessary.
*/
{
    int tcode, maxelem, hdutype;
    long twidth, incre;
    long ntodo;
    LONGLONG repeat, startpos, elemnum, wrtptr, rowlen, rownum, remain, next, tnull;
    double scale, zero;
    char tform[20], cform[20];
    char message[FLEN_ERRMSG];
    size_t formlen;

    char snull[20];   /*  the FITS null value  */

    double cbuff[DBUFFSIZE / sizeof(double)]; /* align cbuff on word boundary */
    void *buffer;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    buffer = cbuff;

    /*---------------------------------------------------*/
    /*  Check input and get parameters about the column: */
    /*---------------------------------------------------*/
    if (ffgcprll( fptr, colnum, firstrow, firstelem, nelem, 1, &scale, &zero,
        tform, &twidth, &tcode, &maxelem, &startpos,  &elemnum, &incre,
        &repeat, &rowlen, &hdutype, &tnull, snull, status) > 0)
        return(*status);

    if (tcode == TSTRING)   
         ffcfmt(tform, cform);     /* derive C format for writing strings */

    /*---------------------------------------------------------------------*/
    /*  Now write the pixels to the FITS column.                           */
    /*  First call the ffXXfYY routine to  (1) convert the datatype        */
    /*  if necessary, and (2) scale the values by the FITS TSCALn and      */
    /*  TZEROn linear scaling parameters into a temporary buffer.          */
    /*---------------------------------------------------------------------*/
    remain = nelem;           /* remaining number of values to write  */
    next = 0;                 /* next element in array to be written  */
    rownum = 0;               /* row number, relative to firstrow     */

    while (remain)
    {
        /* limit the number of pixels to process a one time to the number that
           will fit in the buffer space or to the number of pixels that remain
           in the current vector, which ever is smaller.
        */
        ntodo = (long) minvalue(remain, maxelem);      
        ntodo = (long) minvalue(ntodo, (repeat - elemnum));

        wrtptr = startpos + ((LONGLONG)rownum * rowlen) + (elemnum * incre);

        ffmbyt(fptr, wrtptr, IGNORE_EOF, status); /* move to write position */

        switch (tcode) 
        {
            case (TLONGLONG):

                ffu8fi8(&array[next], ntodo, scale, zero,
                        (LONGLONG *) buffer, status);
                ffpi8b(fptr, ntodo, incre, (long *) buffer, status);
                break;

            case (TLONG):

                ffu8fi4(&array[next], ntodo, scale, zero,
                      (INT32BIT *) buffer, status);
                ffpi4b(fptr, ntodo, incre, (INT32BIT *) buffer, status);
                break;

            case (TBYTE):
 
                ffu8fi1(&array[next], ntodo, scale, zero,
                        (unsigned char *) buffer, status);
                ffpi1b(fptr, ntodo, incre, (unsigned char *) buffer, status);
                break;

            case (TSHORT):

                ffu8fi2(&array[next], ntodo, scale, zero,
                        (short *) buffer, status);
                ffpi2b(fptr, ntodo, incre, (short *) buffer, status);
                break;

            case (TFLOAT):

                ffu8fr4(&array[next], ntodo, scale, zero,
                        (float *) buffer, status);
                ffpr4b(fptr, ntodo, incre, (float *) buffer, status);
                break;

            case (TDOUBLE):
                ffu8fr8(&array[next], ntodo, scale, zero,
                       (double *) buffer, status);
                ffpr8b(fptr, ntodo, incre, (double *) buffer, status);
                break;

            case (TSTRING):  /* numerical column in an ASCII table */

                formlen = strlen(cform);
                if (hdutype == ASCII_TBL && formlen > 1)
                {
                   if (cform[formlen-1] == 'f' || cform[formlen-1] == 'E')
                   {
                     ffu8fstr(&array[next], ntodo, scale, zero, cform,
                             twidth, (char *) buffer, status);

                     if (incre == twidth)    /* contiguous bytes */
                        ffpbyt(fptr, ntodo * twidth, buffer, status);
                     else
                        ffpbytoff(fptr, twidth, ntodo, incre - twidth, buffer,
                               status);

                     break;
                   }
                }
                /* can't write to string column, so fall thru to default: */

            default:  /*  error trap  */
                snprintf(message, FLEN_ERRMSG,
                     "Cannot write numbers to column %d which has format %s",
                      colnum,tform);
                ffpmsg(message);
                if (hdutype == ASCII_TBL)
                    return(*status = BAD_ATABLE_FORMAT);
                else
                    return(*status = BAD_BTABLE_FORMAT);

        } /* End of switch block */

        /*-------------------------*/
        /*  Check for fatal error  */
        /*-------------------------*/
        if (*status > 0)  /* test for error during previous write operation */
        {
          snprintf(message, FLEN_ERRMSG,
          "Error writing elements %.0f thru %.0f of input data array (ffpcluj).",
              (double) (next+1), (double) (next+ntodo));
          ffpmsg(message);
          return(*status);
        }

        /*--------------------------------------------*/
        /*  increment the counters for the next loop  */
        /*--------------------------------------------*/
        remain -= ntodo;
        if (remain)
        {
            next += ntodo;
            elemnum += ntodo;
            if (elemnum == repeat)  /* completed a row; start on next row */
            {
                elemnum = 0;
                rownum++;
            }
        }
    }  /*  End of main while Loop  */


    /*--------------------------------*/
    /*  check for numerical overflow  */
    /*--------------------------------*/
    if (*status == OVERFLOW_ERR)
    {
        ffpmsg(
        "Numerical overflow during type conversion while writing FITS data.");
        *status = NUM_OVERFLOW;
    }

    return(*status);
}